

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enum.cpp
# Opt level: O1

void __thiscall
pfederc::Parser::parseEnumBody
          (Parser *this,bool *err,
          vector<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
          *constructors)

{
  Token *pTVar1;
  Token *pTVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  args;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  local_88;
  Error<pfederc::SyntaxErrorCode> *local_68;
  pointer local_60;
  pointer puStack_58;
  Token *local_50;
  undefined1 local_48 [16];
  
  bVar6 = Token::operator!=(this->lexer->currentToken,TOK_STMT);
  if (bVar6) {
    do {
      bVar6 = Token::operator!=(this->lexer->currentToken,TOK_EOF);
      if (!bVar6) {
        return;
      }
      bVar6 = Token::operator==(this->lexer->currentToken,TOK_EOL);
      if (bVar6) {
        Lexer::next(this->lexer);
      }
      else {
        pTVar1 = this->lexer->currentToken;
        bVar6 = expect(this,TOK_ID);
        if (bVar6) {
          local_88.
          super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_88.
          super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_88.
          super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar6 = Token::operator==(this->lexer->currentToken,TOK_OP_BRACKET_OPEN);
          if (bVar6) {
            Lexer::next(this->lexer);
            parseTraitImpl(this,err,&local_88);
            bVar6 = expect(this,TOK_BRACKET_CLOSE);
            if (!bVar6) {
              pTVar2 = this->lexer->currentToken;
              local_68 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
              sVar4 = (pTVar2->pos).line;
              sVar5 = (pTVar2->pos).startIndex;
              sVar3 = (pTVar2->pos).endIndex;
              local_68->logLevel = LVL_ERROR;
              local_68->err = STX_ERR_EXPECTED_CLOSING_BRACKET;
              (local_68->pos).line = sVar4;
              (local_68->pos).startIndex = sVar5;
              (local_68->pos).endIndex = sVar3;
              (local_68->extraPos).
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (local_68->extraPos).
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (local_68->extraPos).
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              generateError((Parser *)(local_48 + 8),
                            (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                             *)this);
              std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::
              ~unique_ptr((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>
                           *)(local_48 + 8));
              if (local_68 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
                std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                          ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_68,
                           local_68);
              }
            }
          }
          local_68 = (Error<pfederc::SyntaxErrorCode> *)
                     local_88.
                     super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          local_60 = local_88.
                     super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          puStack_58 = local_88.
                       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_88.
          super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_88.
          super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_88.
          super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_50 = pTVar1;
          std::
          vector<std::tuple<pfederc::Token_const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>,std::allocator<std::tuple<pfederc::Token_const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>>>
          ::
          emplace_back<std::tuple<pfederc::Token_const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>>
                    ((vector<std::tuple<pfederc::Token_const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>,std::allocator<std::tuple<pfederc::Token_const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>>>
                      *)constructors,
                     (tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                      *)&local_68);
          std::
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ::~vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                     *)&local_68);
          bVar6 = expect(this,TOK_EOL);
          if (!bVar6) {
            pTVar1 = this->lexer->currentToken;
            local_68 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
            sVar4 = (pTVar1->pos).line;
            sVar5 = (pTVar1->pos).startIndex;
            sVar3 = (pTVar1->pos).endIndex;
            local_68->logLevel = LVL_ERROR;
            local_68->err = STX_ERR_EXPECTED_EOL;
            (local_68->pos).line = sVar4;
            (local_68->pos).startIndex = sVar5;
            (local_68->pos).endIndex = sVar3;
            (local_68->extraPos).
            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (local_68->extraPos).
            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (local_68->extraPos).
            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            generateError((Parser *)local_48,
                          (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)this);
            std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::
            ~unique_ptr((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                        local_48);
            if (local_68 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
              std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                        ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_68,
                         local_68);
            }
            skipToStmtEol(this);
          }
          std::
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ::~vector(&local_88);
        }
        else {
          local_68 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
          sVar4 = (pTVar1->pos).line;
          sVar5 = (pTVar1->pos).startIndex;
          sVar3 = (pTVar1->pos).endIndex;
          local_68->logLevel = LVL_ERROR;
          local_68->err = STX_ERR_EXPECTED_ID;
          (local_68->pos).line = sVar4;
          (local_68->pos).startIndex = sVar5;
          (local_68->pos).endIndex = sVar3;
          (local_68->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (local_68->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (local_68->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          generateError((Parser *)&stack0xffffffffffffffc8,
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)this);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     &stack0xffffffffffffffc8);
          if (local_68 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
            std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                      ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_68,
                       local_68);
          }
          *err = true;
          skipToStmtEol(this);
        }
      }
      bVar6 = Token::operator!=(this->lexer->currentToken,TOK_STMT);
    } while (bVar6);
  }
  return;
}

Assistant:

void Parser::parseEnumBody(bool &err,
    std::vector<EnumConstructor> &constructors) noexcept {
  while (*lexer.getCurrentToken() != TokenType::TOK_STMT
      && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next(); // skip eol
      continue;
    }

    const Token *const tokConstructorId = lexer.getCurrentToken();
    if (!expect(TokenType::TOK_ID)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_ID, tokConstructorId->getPosition()));
      err = true;
      skipToStmtEol();
      continue;
    }

    std::vector<std::unique_ptr<Expr>> args;
    if (*lexer.getCurrentToken() == TokenType::TOK_OP_BRACKET_OPEN) {
      lexer.next(); // eat (

      parseTraitImpl(err, args);
      if (!expect(TokenType::TOK_BRACKET_CLOSE)) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_CLOSING_BRACKET, lexer.getCurrentToken()->getPosition()));
      }
    }

    constructors.push_back(EnumConstructor(tokConstructorId, std::move(args)));

    if (!expect(TokenType::TOK_EOL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      skipToStmtEol();
    }
  }
}